

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

string * __thiscall
fasttext::Dictionary::getWord_abi_cxx11_(string *__return_storage_ptr__,Dictionary *this,int32_t id)

{
  pointer peVar1;
  _Alloc_hider _Var2;
  
  if (id < 0) {
    __assert_fail("id >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/dictionary.cc"
                  ,0x96,"std::string fasttext::Dictionary::getWord(int32_t) const");
  }
  if (id < this->size_) {
    peVar1 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    _Var2._M_p = peVar1[(uint)id].word._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,_Var2._M_p,
               _Var2._M_p + peVar1[(uint)id].word._M_string_length);
    return __return_storage_ptr__;
  }
  __assert_fail("id < size_",
                "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/dictionary.cc"
                ,0x97,"std::string fasttext::Dictionary::getWord(int32_t) const");
}

Assistant:

std::string Dictionary::getWord(int32_t id) const {
  assert(id >= 0);
  assert(id < size_);
  return words_[id].word;
}